

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SequenceRepeatLayerParams::SerializeWithCachedSizes
          (SequenceRepeatLayerParams *this,CodedOutputStream *output)

{
  uint64 uVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SequenceRepeatLayerParams *this_local;
  
  uVar1 = nrepetitions(this);
  if (uVar1 != 0) {
    uVar1 = nrepetitions(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar1,output);
  }
  return;
}

Assistant:

void SequenceRepeatLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SequenceRepeatLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 nRepetitions = 1;
  if (this->nrepetitions() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->nrepetitions(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SequenceRepeatLayerParams)
}